

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.hpp
# Opt level: O2

void libtorrent::aux::write_address<std::back_insert_iterator<std::__cxx11::string>>
               (address *a,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *out)

{
  long lVar1;
  uchar local_38 [8];
  undefined8 uStack_30;
  undefined1 local_28 [24];
  
  if (a->type_ == ipv6) {
    boost::asio::ip::address::to_v6((address_v6 *)local_28,a);
    uStack_30 = local_28._8_8_;
    for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
      write_impl<unsigned_char,unsigned_char,std::back_insert_iterator<std::__cxx11::string>>
                (local_38[lVar1],out);
    }
  }
  else if (a->type_ == ipv4) {
    boost::asio::ip::address::to_v4((address *)local_28);
    write_impl<unsigned_int,unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
              ((uint)local_28._0_4_ >> 0x18 | (local_28._0_4_ & 0xff0000) >> 8 |
               (local_28._0_4_ & 0xff00) << 8 | local_28._0_4_ << 0x18,out);
  }
  return;
}

Assistant:

void write_address(address const& a, OutIt&& out)
	{
		if (a.is_v4())
		{
			write_uint32(a.to_v4().to_uint(), out);
		}
		else if (a.is_v6())
		{
			for (auto b : a.to_v6().to_bytes())
				write_uint8(b, out);
		}
	}